

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3BtreeNext(BtCursor *pCur,int *pRes)

{
  MemPage *pMVar1;
  ushort uVar2;
  int iVar3;
  undefined4 *in_RSI;
  BtCursor *in_RDI;
  MemPage *pPage;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  (in_RDI->info).nSize = 0;
  in_RDI->curFlags = in_RDI->curFlags & 0xf9;
  *in_RSI = 0;
  if (in_RDI->eState == '\x01') {
    pMVar1 = in_RDI->apPage[in_RDI->iPage];
    uVar2 = in_RDI->aiIdx[in_RDI->iPage] + 1;
    in_RDI->aiIdx[in_RDI->iPage] = uVar2;
    if (uVar2 < pMVar1->nCell) {
      if (pMVar1->leaf == '\0') {
        iVar3 = moveToLeftmost(in_RDI);
      }
      else {
        iVar3 = 0;
      }
    }
    else {
      in_RDI->aiIdx[in_RDI->iPage] = in_RDI->aiIdx[in_RDI->iPage] - 1;
      iVar3 = btreeNext((BtCursor *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                        (int *)in_RDI);
    }
  }
  else {
    iVar3 = btreeNext((BtCursor *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                      (int *)in_RDI);
  }
  return iVar3;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeNext(BtCursor *pCur, int *pRes){
  MemPage *pPage;
  assert( cursorHoldsMutex(pCur) );
  assert( pRes!=0 );
  assert( *pRes==0 || *pRes==1 );
  assert( pCur->skipNext==0 || pCur->eState!=CURSOR_VALID );
  pCur->info.nSize = 0;
  pCur->curFlags &= ~(BTCF_ValidNKey|BTCF_ValidOvfl);
  *pRes = 0;
  if( pCur->eState!=CURSOR_VALID ) return btreeNext(pCur, pRes);
  pPage = pCur->apPage[pCur->iPage];
  if( (++pCur->aiIdx[pCur->iPage])>=pPage->nCell ){
    pCur->aiIdx[pCur->iPage]--;
    return btreeNext(pCur, pRes);
  }
  if( pPage->leaf ){
    return SQLITE_OK;
  }else{
    return moveToLeftmost(pCur);
  }
}